

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O0

int LinearSearch(int *a,int n,int x)

{
  bool bVar1;
  int local_24;
  int local_1c;
  int i;
  int x_local;
  int n_local;
  int *a_local;
  
  local_1c = 0;
  while( true ) {
    bVar1 = false;
    if (local_1c < n) {
      bVar1 = a[local_1c] != x;
    }
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  if (local_1c < n) {
    local_24 = local_1c;
  }
  else {
    local_24 = -1;
  }
  return local_24;
}

Assistant:

int LinearSearch(int * a, int n, int x)
{
	int i = 0;
	while ( i < n && a[i] != x)
		i++;
	return (i < n) ? i : -1;
}